

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

json_iterator __thiscall JSONNode::end(JSONNode *this)

{
  internalJSONNode *piVar1;
  uchar uVar2;
  json_string *__lhs;
  JSONNode **starter;
  JSONNode *in_RSI;
  bool local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  json_string local_38;
  JSONNode *this_local;
  
  piVar1 = in_RSI->internal;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar2 = type(in_RSI);
  local_99 = true;
  if (uVar2 != '\x05') {
    uVar2 = type(in_RSI);
    local_99 = uVar2 == '\x04';
  }
  __lhs = jsonSingletonERROR_NON_ITERATABLE::getValue_abi_cxx11_();
  std::operator+(&local_70,__lhs,"end");
  JSONDebug::_JSON_ASSERT(local_99,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  makeUniqueInternal(in_RSI);
  starter = internalJSONNode::end(in_RSI->internal);
  iterator::iterator((iterator *)this,starter);
  return (json_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::json_iterator JSONNode::end(void) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("end"));
	   makeUniqueInternal();
	   return json_iterator(internal -> end());
    }